

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O1

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcCurtainWall,_0UL>::Construct
                   (DB *db,LIST *params)

{
  IfcCurtainWall *in;
  
  in = (IfcCurtainWall *)operator_new(0x170);
  *(undefined ***)&(in->super_IfcBuildingElement).field_0x158 = &PTR__Object_008278a0;
  *(undefined8 *)&in->field_0x160 = 0;
  *(char **)&in->field_0x168 = "IfcCurtainWall";
  Assimp::IFC::Schema_2x3::IfcBuildingElement::IfcBuildingElement
            ((IfcBuildingElement *)in,&PTR_construction_vtable_24__008c3328);
  *(undefined ***)&(in->super_IfcBuildingElement).super_IfcElement.super_IfcProduct.super_IfcObject
       = &PTR__IfcCurtainWall_008c31f8;
  *(undefined ***)&(in->super_IfcBuildingElement).field_0x158 = &PTR__IfcCurtainWall_008c3310;
  *(undefined ***)
   &(in->super_IfcBuildingElement).super_IfcElement.super_IfcProduct.super_IfcObject.field_0x88 =
       &PTR__IfcCurtainWall_008c3220;
  (in->super_IfcBuildingElement).super_IfcElement.super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcCurtainWall_008c3248;
  *(undefined ***)
   &(in->super_IfcBuildingElement).super_IfcElement.super_IfcProduct.super_IfcObject.field_0xd0 =
       &PTR__IfcCurtainWall_008c3270;
  *(undefined ***)&(in->super_IfcBuildingElement).super_IfcElement.super_IfcProduct.field_0x100 =
       &PTR__IfcCurtainWall_008c3298;
  *(undefined ***)&(in->super_IfcBuildingElement).super_IfcElement.field_0x138 =
       &PTR__IfcCurtainWall_008c32c0;
  *(undefined ***)&(in->super_IfcBuildingElement).super_IfcElement.field_0x148 =
       &PTR__IfcCurtainWall_008c32e8;
  GenericFill<Assimp::IFC::Schema_2x3::IfcCurtainWall>(db,params,in);
  return (Object *)
         (&(in->super_IfcBuildingElement).super_IfcElement.super_IfcProduct.super_IfcObject.
           field_0x0 +
         *(long *)(*(long *)&(in->super_IfcBuildingElement).super_IfcElement.super_IfcProduct.
                             super_IfcObject + -0x18));
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }